

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::SocketHandlerConnected
          (CConnman *this,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          EventsPerSock *events_per_sock)

{
  int err;
  pointer ppCVar1;
  CNode *node;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int *p_Var4;
  undefined1 *puVar5;
  bool bVar6;
  uint uVar7;
  const_iterator cVar8;
  int *piVar9;
  Logger *pLVar10;
  byte bVar11;
  undefined1 *puVar12;
  string *__return_storage_ptr__;
  byte bVar13;
  pointer ppCVar14;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Span<const_unsigned_char> msg_bytes;
  pair<unsigned_long,_bool> pVar15;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock69;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  
  puVar5 = &stack0xffffffffffffffd0;
  do {
    puVar12 = puVar5;
    *(undefined8 *)(puVar12 + -0x1000) = 0;
    puVar5 = puVar12 + -0x1000;
  } while ((bool *)(puVar12 + -0x1000) != &criticalblock67.super_unique_lock._M_owns);
  *(EventsPerSock **)(puVar12 + -0x1048) = events_per_sock;
  *(CConnman **)(puVar12 + -0x1050) = this;
  *(undefined8 *)(puVar12 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ppCVar14 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar1 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  *(pointer *)(puVar12 + -0x1038) = ppCVar1;
  if (ppCVar14 != ppCVar1) {
    *(long *)(puVar12 + -0x1040) = *(long *)(puVar12 + -0x1050) + 0x308;
    do {
      __return_storage_ptr__ = (string *)(puVar12 + -0x1008);
      node = *ppCVar14;
      *(undefined8 *)(puVar12 + -0x1060) = 0x1a797d;
      bVar6 = CThreadInterrupt::operator_cast_to_bool(*(CThreadInterrupt **)(puVar12 + -0x1040));
      if (bVar6) break;
      *(Mutex **)(puVar12 + -0x1008) = &node->m_sock_mutex;
      puVar12[-0x1000] = 0;
      *(undefined8 *)(puVar12 + -0x1060) = 0x1a799e;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
      peVar2 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
LAB_001a7b2c:
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b31;
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)__return_storage_ptr__);
      }
      else {
        *(element_type **)(puVar12 + -0x1028) = peVar2;
        p_Var3 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) = p_Var3;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a79e4;
        cVar8 = std::
                _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(*(_Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         **)(puVar12 + -0x1048),(key_type *)(puVar12 + -0x1028));
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a79f6;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020));
        }
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
            ._M_cur == (__node_type *)0x0) {
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a81;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          bVar13 = 0;
          bVar11 = 0;
        }
        else {
          bVar11 = *(byte *)((long)cVar8.
                                   super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                                   ._M_cur + 0x19);
          bVar13 = (bVar11 & 4) >> 2;
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a14;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          if ((bVar11 & 2) != 0) {
            *(Mutex **)(puVar12 + -0x1008) = &node->cs_vSend;
            puVar12[-0x1000] = 0;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a32;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a3f;
            pVar15 = SocketSendData(*(CConnman **)(puVar12 + -0x1050),node);
            puVar12[-0x1051] = pVar15.second;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a50;
            std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)(puVar12 + -0x1008));
            if (pVar15.first != 0) {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7a62;
              RecordBytesSent(*(CConnman **)(puVar12 + -0x1050),pVar15.first);
              if ((puVar12[-0x1051] & 1) != 0) {
                bVar11 = 0;
              }
            }
          }
        }
        __return_storage_ptr__ = (string *)(puVar12 + -0x1028);
        if (bVar13 != 0 || (bVar11 & 1) != 0) {
          *(Mutex **)(puVar12 + -0x1028) = &node->m_sock_mutex;
          puVar12[-0x1020] = 0;
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a7aaa;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
          peVar2 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0) goto LAB_001a7b2c;
          p_Var4 = peVar2->_vptr_Sock[4];
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a7ac6;
          uVar7 = (*p_Var4)(peVar2,puVar12 + -0x1008,0x10000,0x40);
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a7ad1;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          if ((int)uVar7 < 1) {
            if (uVar7 == 0) {
              if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
                *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b6e;
                pLVar10 = LogInstance();
                *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b80;
                bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                if (bVar6) {
                  *(NodeId *)(puVar12 + -0x1028) = node->id;
                  *(string **)(puVar12 + -0x1068) = __return_storage_ptr__;
                  *(char **)(puVar12 + -0x1070) = "socket closed for peer=%d\n";
                  *(undefined8 *)(puVar12 + -0x1078) = 1;
                  *(undefined8 *)(puVar12 + -0x1080) = 0x1a7bc9;
                  logging_function._M_str = "SocketHandlerConnected";
                  logging_function._M_len = 0x16;
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file._M_len = 0x50;
                  LogPrintf_<long>(logging_function,source_file,0x84f,NET,
                                   *(Level *)(puVar12 + -0x1078),*(char **)(puVar12 + -0x1070),
                                   *(long **)(puVar12 + -0x1068));
                }
              }
LAB_001a7c7e:
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7c86;
              CNode::CloseSocketDisconnect(node);
            }
            else {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b3d;
              piVar9 = __errno_location();
              err = *piVar9;
              if (err < 0x5a) {
                if ((err != 4) && (err != 0xb)) {
LAB_001a7be4:
                  if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
                    *(undefined8 *)(puVar12 + -0x1060) = 0x1a7bf7;
                    pLVar10 = LogInstance();
                    *(undefined8 *)(puVar12 + -0x1060) = 0x1a7c09;
                    bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                    if (bVar6) {
                      *(NodeId *)(puVar12 + -0x1030) = node->id;
                      *(undefined8 *)(puVar12 + -0x1060) = 0x1a7c23;
                      NetworkErrorString_abi_cxx11_(__return_storage_ptr__,err);
                      *(string **)(puVar12 + -0x1060) = __return_storage_ptr__;
                      *(undefined1 **)(puVar12 + -0x1068) = puVar12 + -0x1030;
                      *(char **)(puVar12 + -0x1070) = "socket recv error for peer=%d: %s\n";
                      *(undefined8 *)(puVar12 + -0x1078) = 1;
                      *(undefined8 *)(puVar12 + -0x1080) = 0x1a7c5e;
                      logging_function_00._M_str = "SocketHandlerConnected";
                      logging_function_00._M_len = 0x16;
                      source_file_00._M_str =
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                      ;
                      source_file_00._M_len = 0x50;
                      LogPrintf_<long,std::__cxx11::string>
                                (logging_function_00,source_file_00,0x85a,NET,
                                 *(Level *)(puVar12 + -0x1078),*(char **)(puVar12 + -0x1070),
                                 *(long **)(puVar12 + -0x1068),
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(puVar12 + -0x1060));
                      if (*(undefined1 **)(puVar12 + -0x1028) != puVar12 + -0x1018) {
                        *(undefined8 *)(puVar12 + -0x1060) = 0x1a7c7e;
                        operator_delete(*(undefined1 **)(puVar12 + -0x1028),
                                        *(long *)(puVar12 + -0x1018) + 1);
                      }
                    }
                  }
                  goto LAB_001a7c7e;
                }
              }
              else if ((err != 0x5a) && (err != 0x73)) goto LAB_001a7be4;
            }
          }
          else {
            puVar12[-0x1028] = 0;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a7af1;
            msg_bytes.m_size._0_4_ = uVar7 & 0x7fffffff;
            msg_bytes.m_data = puVar12 + -0x1008;
            msg_bytes.m_size._4_4_ = 0;
            bVar6 = CNode::ReceiveMsgBytes(node,msg_bytes,(bool *)__return_storage_ptr__);
            if (!bVar6) {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7afd;
              CNode::CloseSocketDisconnect(node);
            }
            LOCK();
            *(long *)(*(long *)(puVar12 + -0x1050) + 0x28) =
                 *(long *)(*(long *)(puVar12 + -0x1050) + 0x28) + (ulong)(uVar7 & 0x7fffffff);
            UNLOCK();
            if (puVar12[-0x1028] == '\x01') {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b1a;
              CNode::MarkReceivedMsgsForProcessing(node);
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a7b24;
              WakeMessageHandler(*(CConnman **)(puVar12 + -0x1050));
            }
          }
        }
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a7c93;
        bVar6 = InactivityCheck(*(CConnman **)(puVar12 + -0x1050),node);
        if (bVar6) {
          LOCK();
          (node->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
      }
      ppCVar14 = ppCVar14 + 1;
    } while (ppCVar14 != *(pointer *)(puVar12 + -0x1038));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar12 + 0xeff8)) {
    *(undefined **)(puVar12 + -0x1060) = &UNK_001a7d65;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerConnected(const std::vector<CNode*>& nodes,
                                      const Sock::EventsPerSock& events_per_sock)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    for (CNode* pnode : nodes) {
        if (interruptNet)
            return;

        //
        // Receive
        //
        bool recvSet = false;
        bool sendSet = false;
        bool errorSet = false;
        {
            LOCK(pnode->m_sock_mutex);
            if (!pnode->m_sock) {
                continue;
            }
            const auto it = events_per_sock.find(pnode->m_sock);
            if (it != events_per_sock.end()) {
                recvSet = it->second.occurred & Sock::RECV;
                sendSet = it->second.occurred & Sock::SEND;
                errorSet = it->second.occurred & Sock::ERR;
            }
        }

        if (sendSet) {
            // Send data
            auto [bytes_sent, data_left] = WITH_LOCK(pnode->cs_vSend, return SocketSendData(*pnode));
            if (bytes_sent) {
                RecordBytesSent(bytes_sent);

                // If both receiving and (non-optimistic) sending were possible, we first attempt
                // sending. If that succeeds, but does not fully drain the send queue, do not
                // attempt to receive. This avoids needlessly queueing data if the remote peer
                // is slow at receiving data, by means of TCP flow control. We only do this when
                // sending actually succeeded to make sure progress is always made; otherwise a
                // deadlock would be possible when both sides have data to send, but neither is
                // receiving.
                if (data_left) recvSet = false;
            }
        }

        if (recvSet || errorSet)
        {
            // typical socket buffer is 8K-64K
            uint8_t pchBuf[0x10000];
            int nBytes = 0;
            {
                LOCK(pnode->m_sock_mutex);
                if (!pnode->m_sock) {
                    continue;
                }
                nBytes = pnode->m_sock->Recv(pchBuf, sizeof(pchBuf), MSG_DONTWAIT);
            }
            if (nBytes > 0)
            {
                bool notify = false;
                if (!pnode->ReceiveMsgBytes({pchBuf, (size_t)nBytes}, notify)) {
                    pnode->CloseSocketDisconnect();
                }
                RecordBytesRecv(nBytes);
                if (notify) {
                    pnode->MarkReceivedMsgsForProcessing();
                    WakeMessageHandler();
                }
            }
            else if (nBytes == 0)
            {
                // socket closed gracefully
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "socket closed for peer=%d\n", pnode->GetId());
                }
                pnode->CloseSocketDisconnect();
            }
            else if (nBytes < 0)
            {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS)
                {
                    if (!pnode->fDisconnect) {
                        LogDebug(BCLog::NET, "socket recv error for peer=%d: %s\n", pnode->GetId(), NetworkErrorString(nErr));
                    }
                    pnode->CloseSocketDisconnect();
                }
            }
        }

        if (InactivityCheck(*pnode)) pnode->fDisconnect = true;
    }
}